

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

char16 * Js::JavascriptString::AllocateLeafAndCopySz
                   (Recycler *recycler,char16 *content,charcount_t length)

{
  Recycler *this;
  char16_t *dst;
  ulong count;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  if (length < 0x7ffffffe) {
    count = (ulong)(length + 1);
    local_50 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_7ec8d8c;
    data.filename._0_4_ = 0xe7a;
    data.plusSize = count;
    this = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_50);
    dst = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                    ((Memory *)this,(Recycler *)Memory::Recycler::AllocLeaf,0,count);
    js_wmemcpy_s(dst,count,content,(ulong)length);
    dst[length] = L'\0';
    return dst;
  }
  Throw::OutOfMemory();
}

Assistant:

char16* JavascriptString::AllocateLeafAndCopySz(__in Recycler* recycler, __in_ecount(length) const char16* content, charcount_t length)
    {
        // Note: Intentionally not using SafeSzSize nor hoisting common
        // sub-expression "length + 1" into a local variable otherwise
        // Prefast gets confused and cannot track buffer's length.

        // JavascriptString::MaxCharLength is valid; however, we are incrementing below by 1 and want to make sure we aren't overflowing
        // Nor going outside of valid range.
        if (length >= JavascriptString::MaxCharLength)
        {
            Throw::OutOfMemory();
        }

        charcount_t bufLen = length + 1;
        // Allocate recycler memory to store the string plus a terminating NUL
        char16* buffer = RecyclerNewArrayLeaf(recycler, char16, bufLen);
        js_wmemcpy_s(buffer, bufLen, content, length);
        buffer[length] = _u('\0');

        return buffer;
    }